

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Neuron_testApplyInTime_Test::TestBody(Neuron_testApplyInTime_Test *this)

{
  long lVar1;
  undefined8 uVar2;
  internal iVar3;
  bool bVar4;
  ostream *poVar5;
  char *in_R9;
  uint uVar6;
  float fVar7;
  AssertionResult gtest_ar_;
  Neuron n;
  ofstream fn;
  ofstream fns;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  internal local_4e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  string local_4d0;
  AssertHelper local_4b0;
  double local_4a8;
  Neuron local_4a0;
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  std::ofstream::ofstream(&local_430);
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_430,0x142389);
  std::ofstream::open((char *)&local_230,0x142397);
  Neuron::Neuron(&local_4a0,10.0,1.0,50.0);
  uVar6 = 0;
  do {
    fVar7 = Neuron::mem(&local_4a0);
    local_4a8 = (double)CONCAT44(local_4a8._4_4_,fVar7);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_430,uVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; ",2);
    local_4a8 = (double)local_4a8._0_4_;
    poVar5 = std::ostream::_M_insert<double>(local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; ",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,">",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," U=",3);
    poVar5 = std::ostream::_M_insert<double>(local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," I=",3);
    fVar7 = Neuron::syn(&local_4a0);
    poVar5 = std::ostream::_M_insert<double>((double)fVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar3 = (internal)Neuron::tick(&local_4a0,1.0);
    if ((bool)iVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\t\t\t****** spike\n",0x10);
    }
    if ((int)uVar6 < 0xe6) {
      if ((int)uVar6 < 0x31) {
        if (uVar6 == 10) {
          Neuron::apply(&local_4a0,50.0,(Connection *)0x0);
        }
        else if (uVar6 == 0x30) {
          fVar7 = Neuron::mem(&local_4a0);
          local_4e0[0] = (internal)(0.0 < fVar7);
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (fVar7 <= 0.0) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.mem() > 0","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x7a,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
      else if (uVar6 == 0x31) {
        local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_4e0[0] = iVar3;
        if (!(bool)iVar3) {
          testing::Message::Message((Message *)&local_4e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_4d0,local_4e0,(AssertionResult *)"fired","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0x7d,local_4d0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
          testing::internal::AssertHelper::~AssertHelper(&local_4b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p);
          }
          if (local_4e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_4e8.ptr_ + 8))();
            }
            local_4e8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_4d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        if (uVar6 == 100) {
          bVar4 = Neuron::apply(&local_4a0,80.0,(Connection *)0x0);
          local_4e0[0] = (internal)!bVar4;
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar4) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(80)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x80,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          goto LAB_0011ef1a;
        }
        if (uVar6 == 200) {
          local_4e0[0] = (internal)Neuron::apply(&local_4a0,50.0,(Connection *)0x0);
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_4e0[0]) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(50)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x83,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          goto LAB_0011ef0d;
        }
      }
    }
    else {
LAB_0011ef0d:
      if ((int)uVar6 < 0x154) {
LAB_0011ef1a:
        if (uVar6 == 0xe6) {
          local_4e0[0] = (internal)Neuron::apply(&local_4a0,-50.0,(Connection *)0x0);
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_4e0[0]) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(-50)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x86,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else if (uVar6 == 0x104) {
          local_4e0[0] = (internal)Neuron::apply(&local_4a0,-50.0,(Connection *)0x0);
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_4e0[0]) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(-50)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x89,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          goto LAB_0011f303;
        }
      }
      else {
LAB_0011f303:
        if (uVar6 == 0x154) {
          local_4e0[0] = (internal)Neuron::apply(&local_4a0,10.0,(Connection *)0x0);
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_4e0[0]) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(10)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x8c,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        if (uVar6 == 400) {
          local_4e0[0] = (internal)Neuron::apply(&local_4a0,160.0,(Connection *)0x0);
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_4e0[0]) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(160)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x8f,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        if (uVar6 == 0x1cc) {
          bVar4 = Neuron::apply(&local_4a0,160.0,(Connection *)0x0);
          local_4e0[0] = (internal)!bVar4;
          local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar4) {
            testing::Message::Message((Message *)&local_4e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_4d0,local_4e0,(AssertionResult *)"n.apply(160)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                       ,0x92,local_4d0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p);
            }
            if (local_4e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_4e8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_4e8.ptr_ + 8))();
              }
              local_4e8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_4d8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
    }
    if (uVar6 - 0x32 < 0x16c) {
      local_4e0[0] = (internal)!(bool)iVar3;
      local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_4e0[0]) {
        testing::Message::Message((Message *)&local_4e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_4d0,local_4e0,(AssertionResult *)"fired","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x95,local_4d0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p);
        }
        if (local_4e8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_4e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_4e8.ptr_ + 8))();
          }
          local_4e8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_4d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if (uVar6 == 0x244) {
      local_4e0[0] = (internal)Neuron::apply(&local_4a0,50.0,(Connection *)0x0);
      local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_4e0[0]) {
        testing::Message::Message((Message *)&local_4e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_4d0,local_4e0,(AssertionResult *)"n.apply(50)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x98,local_4d0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p);
        }
        if (local_4e8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_4e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_4e8.ptr_ + 8))();
          }
          local_4e8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_4d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if (0x28a < uVar6) {
      local_4e0[0] = (internal)!(bool)iVar3;
      local_4d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_4e0[0]) {
        testing::Message::Message((Message *)&local_4e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_4d0,local_4e0,(AssertionResult *)"fired","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x9b,local_4d0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4e8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p);
        }
        if (local_4e8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_4e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_4e8.ptr_ + 8))();
          }
          local_4e8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_4d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 1000) {
      std::
      vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
      ::~vector(&local_4a0.m_watchFor);
      if (local_4a0.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a0.m_incomingSpikes.
                        super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4a0.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a0.m_connections.
                        super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar2 = ___throw_bad_array_new_length;
      lVar1 = _VTT;
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(aiStack_138);
      local_430 = lVar1;
      *(undefined8 *)(local_428 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
      std::filebuf::~filebuf(local_428);
      std::ios_base::~ios_base(aiStack_338);
      return;
    }
  } while( true );
}

Assistant:

TEST(Neuron, testApplyInTime)
{
    std::ofstream fn, fns;
    fn.open("testApply.csv");
    fns.open("testApply.txt");

    Neuron n(10, 1, 50);

    for (int t = 0; t < 1000; ++t) {
        float mem = n.mem();
        fn << t << "; " << mem << "; " << std::endl;
        fns << ">" << t << " U=" << mem << " I="<< n.syn() << std::endl;

        bool fired = n.tick(TIME_STEP);
        if (fired)
            fns << "\t\t\t****** spike\n";

        if (t == 10)
            n.apply(50);

        if (t == 48)
            EXPECT_TRUE(n.mem() > 0);

        if (t == 49)
            EXPECT_TRUE(fired);

        if (t == 100)
            EXPECT_FALSE(n.apply(80));

        if (t == 200)
            EXPECT_TRUE(n.apply(50));

        if (t == 230)
            EXPECT_TRUE(n.apply(-50));

        if (t == 260)
            EXPECT_TRUE(n.apply(-50));

        if (t == 340)
            EXPECT_TRUE(n.apply(10));

        if (t == 400)
            EXPECT_TRUE(n.apply(160));

        if (t == 460)
            EXPECT_FALSE(n.apply(160));

        if (t >=50 && t < 414)
            EXPECT_FALSE(fired);

        if (t == 580)
            EXPECT_TRUE(n.apply(50));

        if (t > 650)
            EXPECT_FALSE(fired);
    }
}